

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators_inl.hpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* CLI::detail::split_program_name
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *commandline)

{
  __nlink_t *p_Var1;
  byte bVar2;
  char cVar3;
  char cVar4;
  pointer pcVar5;
  int iVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  ulong uVar8;
  long lVar9;
  long *plVar10;
  ulong uVar11;
  long *plVar12;
  char cVar13;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  stat buffer;
  undefined1 *local_148;
  __nlink_t *local_140;
  __ino_t local_138;
  undefined1 local_130;
  undefined7 uStack_12f;
  ulong uStack_128;
  long *local_120;
  char *local_118;
  long local_110;
  long lStack_108;
  char *local_100;
  ulong local_f8;
  char local_f0 [16];
  undefined1 *local_e0;
  long local_d8;
  undefined1 local_d0 [16];
  stat local_c0;
  
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_string_length = 0;
  (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_string_length = 0;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
  local_100 = (commandline->_M_dataplus)._M_p;
  local_c0.st_dev = (__dev_t)(local_100 + commandline->_M_string_length);
  ::std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
            (&local_148);
  commandline->_M_string_length = (long)local_148 - (long)(commandline->_M_dataplus)._M_p;
  *local_148 = 0;
  _Var7 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                    ();
  pcVar5 = (commandline->_M_dataplus)._M_p;
  if (pcVar5 + commandline->_M_string_length == _Var7._M_current) {
    commandline->_M_string_length = 0;
    *pcVar5 = '\0';
  }
  else {
    ::std::__cxx11::string::_M_erase((ulong)commandline,0);
  }
  cVar13 = (char)commandline;
  uVar8 = ::std::__cxx11::string::find(cVar13,0x20);
  do {
    ::std::__cxx11::string::substr((ulong)&local_100,(ulong)commandline);
    iVar6 = stat(local_100,&local_c0);
    uVar11 = local_c0._24_8_ & 0x4000;
    if (local_100 != local_f0) {
      operator_delete(local_100);
    }
    if (uVar11 == 0 && iVar6 == 0) goto LAB_001ab46b;
    uVar8 = ::std::__cxx11::string::find(cVar13,0x20);
  } while (uVar8 != 0xffffffffffffffff);
  bVar2 = *(commandline->_M_dataplus)._M_p;
  if ((bVar2 - 0x22 < 0x3f) && ((0x4000000000000021U >> ((ulong)(bVar2 - 0x22) & 0x3f) & 1) != 0)) {
    lVar9 = ::std::__cxx11::string::find(cVar13,(ulong)(uint)(int)(char)bVar2);
    if (lVar9 != -1) {
      cVar3 = (commandline->_M_dataplus)._M_p[lVar9 + -1];
      cVar4 = cVar3;
      while (cVar4 == '\\') {
        lVar9 = ::std::__cxx11::string::find(cVar13,(ulong)(uint)(int)(char)bVar2);
        if (lVar9 == -1) goto LAB_001ab451;
        cVar4 = (commandline->_M_dataplus)._M_p[lVar9 + -1];
      }
      ::std::__cxx11::string::substr((ulong)&local_c0,(ulong)commandline);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c0);
      p_Var1 = &local_c0.st_nlink;
      if ((__nlink_t *)local_c0.st_dev != p_Var1) {
        operator_delete((void *)local_c0.st_dev);
      }
      uVar8 = lVar9 + 1;
      if (cVar3 == '\\') {
        local_140 = (__nlink_t *)&local_130;
        pcVar5 = (__return_storage_ptr__->first)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_140,pcVar5,
                   pcVar5 + (__return_storage_ptr__->first)._M_string_length);
        local_100 = local_f0;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"\\","");
        plVar10 = (long *)::std::__cxx11::string::_M_replace_aux
                                    ((ulong)&local_100,local_f8,0,'\x01');
        local_120 = &local_110;
        plVar12 = plVar10 + 2;
        if ((long *)*plVar10 == plVar12) {
          local_110 = *plVar12;
          lStack_108 = plVar10[3];
        }
        else {
          local_110 = *plVar12;
          local_120 = (long *)*plVar10;
        }
        local_118 = (char *)plVar10[1];
        *plVar10 = (long)plVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        local_e0 = local_d0;
        ::std::__cxx11::string::_M_construct((ulong)&local_e0,'\x01');
        uVar11 = ::std::__cxx11::string::find((char *)&local_140,(ulong)local_120,0);
        if (uVar11 != 0xffffffffffffffff) {
          do {
            ::std::__cxx11::string::replace((ulong)&local_140,uVar11,local_118,(ulong)local_e0);
            uVar11 = ::std::__cxx11::string::find
                               ((char *)&local_140,(ulong)local_120,uVar11 + local_d8);
          } while (uVar11 != 0xffffffffffffffff);
        }
        if (local_140 == (__nlink_t *)&local_130) {
          local_c0.st_mode = (undefined4)uStack_128;
          local_c0.st_uid = uStack_128._4_4_;
          local_c0.st_dev = (__dev_t)p_Var1;
        }
        else {
          local_c0.st_dev = (__dev_t)local_140;
        }
        local_c0.st_nlink = CONCAT71(uStack_12f,local_130);
        local_c0.st_ino = local_138;
        local_138 = 0;
        local_130 = 0;
        local_140 = (__nlink_t *)&local_130;
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c0);
        if ((__nlink_t *)local_c0.st_dev != p_Var1) {
          operator_delete((void *)local_c0.st_dev);
        }
        if (local_e0 != local_d0) {
          operator_delete(local_e0);
        }
        if (local_120 != &local_110) {
          operator_delete(local_120);
        }
        if (local_100 != local_f0) {
          operator_delete(local_100);
        }
        if (local_140 != (__nlink_t *)&local_130) {
          operator_delete(local_140);
        }
      }
      goto LAB_001ab46b;
    }
  }
LAB_001ab451:
  uVar8 = ::std::__cxx11::string::find(cVar13,0x20);
LAB_001ab46b:
  if ((__return_storage_ptr__->first)._M_string_length == 0) {
    ::std::__cxx11::string::substr((ulong)&local_c0,(ulong)commandline);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c0);
    if ((__nlink_t *)local_c0.st_dev != &local_c0.st_nlink) {
      operator_delete((void *)local_c0.st_dev);
    }
    local_100 = (__return_storage_ptr__->first)._M_dataplus._M_p;
    local_c0.st_dev = (__dev_t)(local_100 + (__return_storage_ptr__->first)._M_string_length);
    ::std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
              (&local_148);
    (__return_storage_ptr__->first)._M_string_length =
         (long)local_148 - (long)(__return_storage_ptr__->first)._M_dataplus._M_p;
    *local_148 = 0;
  }
  if (uVar8 < commandline->_M_string_length - 1) {
    ::std::__cxx11::string::substr((ulong)&local_c0,(ulong)commandline);
  }
  else {
    local_c0.st_dev = (__dev_t)&local_c0.st_nlink;
    local_c0.st_ino = 0;
    local_c0.st_nlink = local_c0.st_nlink & 0xffffffffffffff00;
  }
  ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->second,(string *)&local_c0);
  if ((__nlink_t *)local_c0.st_dev != &local_c0.st_nlink) {
    operator_delete((void *)local_c0.st_dev);
  }
  _Var7 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                    ();
  pcVar5 = (__return_storage_ptr__->second)._M_dataplus._M_p;
  if (pcVar5 + (__return_storage_ptr__->second)._M_string_length == _Var7._M_current) {
    (__return_storage_ptr__->second)._M_string_length = 0;
    *pcVar5 = '\0';
  }
  else {
    ::std::__cxx11::string::_M_erase((ulong)&__return_storage_ptr__->second,0);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::pair<std::string, std::string> split_program_name(std::string commandline) {
    // try to determine the programName
    std::pair<std::string, std::string> vals;
    trim(commandline);
    auto esp = commandline.find_first_of(' ', 1);
    while(detail::check_path(commandline.substr(0, esp).c_str()) != path_type::file) {
        esp = commandline.find_first_of(' ', esp + 1);
        if(esp == std::string::npos) {
            // if we have reached the end and haven't found a valid file just assume the first argument is the
            // program name
            if(commandline[0] == '"' || commandline[0] == '\'' || commandline[0] == '`') {
                bool embeddedQuote = false;
                auto keyChar = commandline[0];
                auto end = commandline.find_first_of(keyChar, 1);
                while((end != std::string::npos) && (commandline[end - 1] == '\\')) {  // deal with escaped quotes
                    end = commandline.find_first_of(keyChar, end + 1);
                    embeddedQuote = true;
                }
                if(end != std::string::npos) {
                    vals.first = commandline.substr(1, end - 1);
                    esp = end + 1;
                    if(embeddedQuote) {
                        vals.first = find_and_replace(vals.first, std::string("\\") + keyChar, std::string(1, keyChar));
                    }
                } else {
                    esp = commandline.find_first_of(' ', 1);
                }
            } else {
                esp = commandline.find_first_of(' ', 1);
            }

            break;
        }
    }
    if(vals.first.empty()) {
        vals.first = commandline.substr(0, esp);
        rtrim(vals.first);
    }

    // strip the program name
    vals.second = (esp < commandline.length() - 1) ? commandline.substr(esp + 1) : std::string{};
    ltrim(vals.second);
    return vals;
}